

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O2

void __thiscall
afsm::test::TranFSM_RealEventSequence_Test::TestBody(TranFSM_RealEventSequence_Test *this)

{
  char *pcVar1;
  connect local_2d9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  AssertHelper local_2d0;
  AssertionResult gtest_ar;
  connection_fsm fsm;
  
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&fsm);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[19]>
            (&fsm.super_observer_wrapper<afsm::test::test_fsm_observer>,
             (char (*) [19])"connection_fsm_def");
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::connect>(&fsm,&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::connect{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::complete>(&fsm,(complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::complete{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>(&fsm,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::begin>(&fsm,(begin *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::begin{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 1;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::execute>(&fsm,(execute *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::defer",
             "fsm.process_event(events::execute{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 1;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::commit>(&fsm,(commit *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::defer",
             "fsm.process_event(events::commit{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ea,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::command_complete>(&fsm,(command_complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process_in_state",
             "fsm.process_event(events::command_complete{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ee,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>(&fsm,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ef,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_description>(&fsm,(row_description *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::row_description{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_event>(&fsm,(row_event *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 2;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::row_event>(&fsm,(row_event *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,499,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::command_complete>(&fsm,(command_complete *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::command_complete{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,500,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>(&fsm,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_2d8.ptr_._0_4_ = 3;
  local_2d0.data_._0_4_ =
       state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::ready_for_query>(&fsm,(ready_for_query *)&local_2d9);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",(event_process_result *)&local_2d8,
             (event_process_result *)&local_2d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine(&fsm);
  return;
}

Assistant:

TEST(TranFSM, RealEventSequence)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    // Connect response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::begin{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::execute{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::commit{}));

    // Server responses
    // Begin
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Simple query responses
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Commit response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
}